

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelproblem_circle_main.cc
# Opt level: O0

int main(int param_1,char **param_2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  uint *x;
  Scalar SVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  ostream *poVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  element_type *peVar8;
  Entity *e;
  double *pdVar9;
  RealScalar RVar10;
  allocator<char> local_e99;
  string local_e98;
  ColXpr local_e78;
  uint local_e3c;
  undefined1 local_e38 [4];
  int global_idx;
  shared_ptr<lf::mesh::utils::CodimMeshDataSet<double>_> nodal_data;
  shared_ptr<const_lf::mesh::Mesh> local_e08;
  undefined1 local_df8 [8];
  VtkWriter vtk_writer;
  stringstream filename;
  ostream local_c10 [380];
  int local_a94;
  undefined1 local_a90 [4];
  int k;
  ColXpr local_a58;
  Matrix<double,__1,_1,_0,__1,_1> local_a20;
  undefined1 local_a10 [16];
  ColXpr local_a00;
  ColXpr local_9c8;
  Matrix<double,__1,_1,_0,__1,_1> local_990;
  undefined1 local_980 [16];
  ColXpr local_970;
  ColXpr local_938;
  Matrix<double,__1,_1,_0,__1,_1> local_900;
  undefined1 local_8f0 [16];
  ColXpr local_8e0;
  ColXpr local_8a8;
  Matrix<double,__1,_1,_0,__1,_1> local_870;
  undefined1 local_860 [16];
  ColXpr local_850;
  undefined1 local_818 [24];
  undefined1 local_800 [8];
  MatrixXd sol;
  StrangSplit StrangSplitter;
  double local_270;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_268;
  undefined1 local_228 [8];
  VectorXd cap;
  double T;
  undefined1 local_208 [4];
  uint m;
  MatrixXd L;
  anon_class_1_0_00000001_for_f_ h;
  double lambda;
  undefined1 local_1d8 [7];
  anon_class_1_0_00000001_for_f_ c;
  VectorXd u0;
  size_type N_dofs;
  DofHandler *dofh;
  undefined1 local_1a8 [8];
  shared_ptr<lf::uscalfe::UniformScalarFESpace<double>_> fe_space;
  shared_ptr<const_lf::mesh::Mesh> mesh_p;
  undefined1 local_180 [8];
  GmshReader reader;
  path local_d0;
  path local_a8;
  undefined1 local_80 [8];
  string mesh_file;
  undefined1 local_50 [8];
  path here;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_20;
  __single_object mesh_factory;
  char **param_1_local;
  int param_0_local;
  long *plVar4;
  
  here._36_4_ = 2;
  mesh_factory._M_t.
  super___uniq_ptr_impl<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  .super__Head_base<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_false>._M_head_impl =
       (__uniq_ptr_data<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>,_true,_true>
        )(__uniq_ptr_data<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>,_true,_true>
          )param_2;
  std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_20);
  std::filesystem::__cxx11::path::path<char[119],std::filesystem::__cxx11::path>
            ((path *)local_50,
             (char (*) [119])
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/fisher_kpp/modelproblem_circle_main.cc"
             ,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::path<char[19],std::filesystem::__cxx11::path>
            ((path *)&reader.nr_2_name_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (char (*) [19])"/meshes/circle.msh",auto_format);
  std::filesystem::__cxx11::operator/
            (&local_a8,&local_d0,
             (path *)&reader.nr_2_name_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::filesystem::__cxx11::path::string((string *)local_80,&local_a8);
  std::filesystem::__cxx11::path::~path(&local_a8);
  std::filesystem::__cxx11::path::~path
            ((path *)&reader.nr_2_name_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::filesystem::__cxx11::path::~path(&local_d0);
  this = &mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
            ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)this,
             &local_20);
  lf::io::GmshReader::GmshReader
            ((GmshReader *)local_180,
             (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)this,
             (string *)local_80);
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
            ((unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)
             &mesh_p.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  lf::io::GmshReader::mesh
            ((GmshReader *)
             &fe_space.
              super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>,std::shared_ptr<lf::mesh::Mesh_const>const&>
            ((shared_ptr<const_lf::mesh::Mesh> *)&dofh);
  std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>>::
  shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>,void>
            ((shared_ptr<lf::uscalfe::UniformScalarFESpace<double>> *)local_1a8,
             (shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&dofh);
  std::shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_>::~shared_ptr
            ((shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)&dofh);
  peVar3 = std::
           __shared_ptr_access<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1a8);
  iVar2 = (*(peVar3->super_ScalarFESpace<double>)._vptr_ScalarFESpace[1])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  u0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
       (**(code **)(*plVar4 + 0x10))();
  poVar5 = std::operator<<((ostream *)&std::cout,"N_dofs :");
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,u0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows._4_4_);
  std::operator<<(poVar5,'\n');
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_1d8,
             (uint *)((long)&u0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + 4));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1d8);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1d8,0);
  *pSVar6 = 0.001;
  poVar5 = std::operator<<((ostream *)&std::cout,"norm u0 ");
  RVar10 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                     ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1d8);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,RVar10);
  std::operator<<(poVar5,'\n');
  lambda._7_1_ = 0;
  L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._7_1_ = 0;
  x = (uint *)((long)&u0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows + 4);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,unsigned_int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_208,x,x);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_208);
  cap.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0x3ff0000000000000;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_228,
             (uint *)((long)&u0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + 4));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_228);
  local_270 = 0.8;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Ones
            ((ConstantReturnType *)&StrangSplitter.solver2.m_detPermC,
             (ulong)u0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows._4_4_);
  Eigen::operator*(&local_268,&local_270,(StorageBaseType *)&StrangSplitter.solver2.m_detPermC);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)local_228,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_268);
  FisherKPP::StrangSplit::StrangSplit<main::__0&,main::__1&>
            ((StrangSplit *)
             &sol.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (shared_ptr<lf::uscalfe::UniformScalarFESpace<double>_> *)local_1a8,1.0,100,0.008,
             (anon_class_1_0_00000001_for_f_ *)((long)&lambda + 7),
             (anon_class_1_0_00000001_for_f_ *)
             ((long)&L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols + 7),(MatrixXd *)local_208);
  local_818._20_4_ = 0x14;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_800,
             (uint *)((long)&u0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + 4),(int *)(local_818 + 0x14));
  FisherKPP::StrangSplit::Evolution
            ((StrangSplit *)local_818,
             (VectorXd *)
             &sol.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (VectorXd *)local_228);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_850,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_800,0);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_850,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_818);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_818);
  poVar5 = std::operator<<((ostream *)&std::cout,"sol1");
  std::operator<<(poVar5,'\n');
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_8a8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_800,0);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_870,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
             &local_8a8);
  FisherKPP::StrangSplit::Evolution
            ((StrangSplit *)local_860,
             (VectorXd *)
             &sol.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (VectorXd *)local_228);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_8e0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_800,1);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_8e0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_860);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_860);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_870);
  poVar5 = std::operator<<((ostream *)&std::cout,"sol2");
  std::operator<<(poVar5,'\n');
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_938,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_800,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_900,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
             &local_938);
  FisherKPP::StrangSplit::Evolution
            ((StrangSplit *)local_8f0,
             (VectorXd *)
             &sol.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (VectorXd *)local_228);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_970,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_800,2);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_970,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_8f0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_8f0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_900);
  poVar5 = std::operator<<((ostream *)&std::cout,"sol3");
  std::operator<<(poVar5,'\n');
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_9c8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_800,2);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_990,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
             &local_9c8);
  FisherKPP::StrangSplit::Evolution
            ((StrangSplit *)local_980,
             (VectorXd *)
             &sol.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (VectorXd *)local_228);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_a00,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_800,3);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_a00,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_980);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_980);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_990);
  poVar5 = std::operator<<((ostream *)&std::cout,"sol4");
  std::operator<<(poVar5,'\n');
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_a58,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_800,3);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_a20,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
             &local_a58);
  FisherKPP::StrangSplit::Evolution
            ((StrangSplit *)local_a10,
             (VectorXd *)
             &sol.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (VectorXd *)local_228);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            ((ColXpr *)local_a90,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_800,4
            );
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)local_a90,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_a10);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_a10);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_a20);
  poVar5 = std::operator<<((ostream *)&std::cout,"sol5");
  std::operator<<(poVar5,'\n');
  for (local_a94 = 1; local_a94 < 6; local_a94 = local_a94 + 1) {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&vtk_writer.aux_node_offset_._M_elems[1].codim_);
    poVar5 = std::operator<<(local_c10,"sol");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_a94);
    std::operator<<(poVar5,".vtk");
    std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
              (&local_e08,
               (shared_ptr<const_lf::mesh::Mesh> *)
               &fe_space.
                super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::stringstream::str();
    lf::io::VtkWriter::VtkWriter
              ((VtkWriter *)local_df8,&local_e08,
               (string *)
               &nodal_data.
                super___shared_ptr<lf::mesh::utils::CodimMeshDataSet<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,0,'\x01');
    std::__cxx11::string::~string
              ((string *)
               &nodal_data.
                super___shared_ptr<lf::mesh::utils::CodimMeshDataSet<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_e08);
    lf::mesh::utils::make_CodimMeshDataSet<double>
              ((utils *)local_e38,
               (shared_ptr<const_lf::mesh::Mesh> *)
               &fe_space.
                super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,2);
    for (local_e3c = 0;
        local_e3c <
        u0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_;
        local_e3c = local_e3c + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_e78,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_800,
                 (long)(local_a94 + -1));
      pSVar7 = Eigen::
               DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
               ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                             *)&local_e78,(long)(int)local_e3c);
      SVar1 = *pSVar7;
      peVar8 = std::
               __shared_ptr_access<lf::mesh::utils::CodimMeshDataSet<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<lf::mesh::utils::CodimMeshDataSet<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_e38);
      e = (Entity *)(**(code **)(*plVar4 + 0x38))(plVar4,(long)(int)local_e3c);
      pdVar9 = lf::mesh::utils::CodimMeshDataSet<double>::operator()(peVar8,e);
      *pdVar9 = SVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e98,"sol",&local_e99);
    peVar8 = std::
             __shared_ptr_access<lf::mesh::utils::CodimMeshDataSet<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<lf::mesh::utils::CodimMeshDataSet<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_e38);
    lf::io::VtkWriter::WritePointData
              ((VtkWriter *)local_df8,&local_e98,&peVar8->super_MeshDataSet<double>,0.0);
    std::__cxx11::string::~string((string *)&local_e98);
    std::allocator<char>::~allocator(&local_e99);
    std::shared_ptr<lf::mesh::utils::CodimMeshDataSet<double>_>::~shared_ptr
              ((shared_ptr<lf::mesh::utils::CodimMeshDataSet<double>_> *)local_e38);
    lf::io::VtkWriter::~VtkWriter((VtkWriter *)local_df8);
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)&vtk_writer.aux_node_offset_._M_elems[1].codim_);
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_800);
  FisherKPP::StrangSplit::~StrangSplit
            ((StrangSplit *)
             &sol.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_228);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_208);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_1d8);
  std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>_>::~shared_ptr
            ((shared_ptr<lf::uscalfe::UniformScalarFESpace<double>_> *)local_1a8);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
            ((shared_ptr<const_lf::mesh::Mesh> *)
             &fe_space.
              super___shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  lf::io::GmshReader::~GmshReader((GmshReader *)local_180);
  std::__cxx11::string::~string((string *)local_80);
  std::filesystem::__cxx11::path::~path((path *)local_50);
  std::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ::~unique_ptr(&local_20);
  return 0;
}

Assistant:

int main(int /*argc*/, char ** /*argv*/) {
  /* Obtain mesh */
  auto mesh_factory = std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
  const std::filesystem::path here = __FILE__;

  /* In case of one circle: Mesh 1. */
  auto mesh_file = (here.parent_path() / "/meshes/circle.msh").string();
  const lf::io::GmshReader reader(std::move(mesh_factory), mesh_file);
  const std::shared_ptr<const lf::mesh::Mesh> mesh_p = reader.mesh();
  /* Finite Element Space */
  std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>> fe_space =
      std::make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>>(mesh_p);
  /* Dofhandler */
  const lf::assemble::DofHandler &dofh{fe_space->LocGlobMap()};
  const lf::uscalfe::size_type N_dofs(dofh.NumDofs());

  std::cout << "N_dofs :" << N_dofs << '\n';

  /* Initial Population density */
  Eigen::VectorXd u0(N_dofs);
  u0.setZero();

  /* In case of the circle: Mesh 1. For one source only: */
  u0(0) = 0.001;
  /* For two sources on the circle: */
  /* u0(0) = 0.0005;
   * u0(53) = 0.0005;
   */

  std::cout << "norm u0 " << u0.norm() << '\n';

  /* Diffusion Coefficient */
  auto c = [](const Eigen::Vector2d & /*x*/) -> double {
    /* In case of the circle: Mesh 1. */
    return 0.007;
  };

  /* Growth Factor */
  /* In case of the circle: Mesh 1. */
  const double lambda = 0.008;

  /* Boundary Conditions. */

  /* In case of the circle: Mesh 1. */
  auto h = [](const Eigen::Vector2d & /*x*/) -> double { return 0.0; };
  Eigen::MatrixXd L(N_dofs, N_dofs);
  L.setZero();

  /* Strang Splitting Method
   * SDIRK-2 evolution of linear parabolic term
   * Exact Evolution for nonlinear reaction term
   */

  /* Total number of timesteps */
  const unsigned int m = 100;
  const double T = 1.;  // the timestepsize tau will equal T/m = 0.01

  /* First we assemble the carrying capacity maps */

  Eigen::VectorXd cap(N_dofs);
  cap.setZero();
  cap = 0.8 * Eigen::VectorXd::Ones(N_dofs);

  /* Now we may compute the solution */
  StrangSplit StrangSplitter(fe_space, T, m, lambda, c, h, L);

  Eigen::MatrixXd sol(N_dofs, 20);

  sol.col(0) = StrangSplitter.Evolution(cap, u0);
  std::cout << "sol1" << '\n';
  sol.col(1) = StrangSplitter.Evolution(cap, sol.col(0));
  std::cout << "sol2" << '\n';
  sol.col(2) = StrangSplitter.Evolution(cap, sol.col(1));
  std::cout << "sol3" << '\n';
  sol.col(3) = StrangSplitter.Evolution(cap, sol.col(2));
  std::cout << "sol4" << '\n';
  sol.col(4) = StrangSplitter.Evolution(cap, sol.col(3));
  std::cout << "sol5" << '\n';

  /* Use VTK-Writer for Visualization of solution */

  for (int k = 1; k < 6; k++) {
    std::stringstream filename;
    filename << "sol" << k << ".vtk";

    lf::io::VtkWriter vtk_writer(mesh_p, filename.str());
    auto nodal_data = lf::mesh::utils::make_CodimMeshDataSet<double>(mesh_p, 2);
    for (int global_idx = 0; global_idx < N_dofs; global_idx++) {
      nodal_data->operator()(dofh.Entity(global_idx)) =
          sol.col(k - 1)[global_idx];
    }

    vtk_writer.WritePointData("sol", *nodal_data);
  }

  return 0;
}